

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O2

void SplitBlock(CPpmd8 *p,void *ptr,uint oldIndx,uint newIndx)

{
  byte bVar1;
  uint uVar2;
  void *node;
  uint indx;
  
  uVar2 = (uint)p->Indx2Units[oldIndx] - (uint)p->Indx2Units[newIndx];
  node = (void *)((ulong)p->Indx2Units[newIndx] * 0xc + (long)ptr);
  bVar1 = p->Units2Indx[uVar2 - 1];
  indx = (uint)bVar1;
  if (uVar2 != p->Indx2Units[bVar1]) {
    indx = bVar1 - 1;
    InsertNode(p,(void *)((ulong)p->Indx2Units[indx] * 0xc + (long)node),
               uVar2 + ~(uint)p->Indx2Units[indx]);
  }
  InsertNode(p,node,indx);
  return;
}

Assistant:

static void SplitBlock(CPpmd7 *p, void *ptr, unsigned oldIndx, unsigned newIndx)
{
  unsigned i, nu = I2U(oldIndx) - I2U(newIndx);
  ptr = (Byte *)ptr + U2B(I2U(newIndx));
  if (I2U(i = U2I(nu)) != nu)
  {
    unsigned k = I2U(--i);
    InsertNode(p, ((Byte *)ptr) + U2B(k), nu - k - 1);
  }
  InsertNode(p, ptr, i);
}